

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedShaderImpl.cpp
# Opt level: O1

vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
* __thiscall
Diligent::SerializedShaderImpl::GetCompileTasks
          (vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
           *__return_storage_ptr__,SerializedShaderImpl *this)

{
  long *plVar1;
  iterator __position;
  IAsyncTask *in_RAX;
  long lVar2;
  RefCntAutoPtr<Diligent::IAsyncTask> pTask;
  RefCntAutoPtr<Diligent::IAsyncTask> local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = -0x38;
  local_28.m_pObject = in_RAX;
  do {
    plVar1 = *(long **)((long)&this[1].super_ObjectBase<Diligent::ISerializedShader>.
                               super_RefCountedObject<Diligent::ISerializedShader>.
                               super_ISerializedShader.super_IShader.super_IDeviceObject.
                               super_IObject._vptr_IObject + lVar2);
    if (plVar1 == (long *)0x0) {
      local_28.m_pObject = (IAsyncTask *)0x0;
    }
    else {
      (**(code **)(*plVar1 + 0x30))(&local_28);
    }
    if (local_28.m_pObject != (IAsyncTask *)0x0) {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
        ::_M_realloc_insert<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
                    *)__return_storage_ptr__,__position,&local_28);
      }
      else {
        (__position._M_current)->m_pObject = local_28.m_pObject;
        local_28.m_pObject = (IAsyncTask *)0x0;
        (__return_storage_ptr__->
        super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    if (local_28.m_pObject != (IAsyncTask *)0x0) {
      (*((local_28.m_pObject)->super_IObject)._vptr_IObject[2])();
      local_28.m_pObject = (IAsyncTask *)0x0;
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<RefCntAutoPtr<IAsyncTask>> SerializedShaderImpl::GetCompileTasks() const
{
    std::vector<RefCntAutoPtr<IAsyncTask>> Tasks;
    for (const auto& pCompiledShader : m_Shaders)
    {
        if (RefCntAutoPtr<IAsyncTask> pTask{pCompiledShader ? pCompiledShader->GetCompileTask() : RefCntAutoPtr<IAsyncTask>{}})
        {
            Tasks.emplace_back(std::move(pTask));
        }
    }
    return Tasks;
}